

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void do_com_sub_exp(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  short *psVar1;
  char cVar2;
  char cVar3;
  special_operations sVar4;
  vreg_info *pvVar5;
  bool bVar6;
  char cVar7;
  uint vreg;
  special_operations vreg_00;
  int iVar8;
  int iVar9;
  virtual_insn *pvVar10;
  void *pvVar11;
  virtual_insn *pvVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  virtual_insn *insn;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  uint local_94;
  int used_vregs [3];
  
  insn = insns + loc;
  vreg = insn_defines(insn);
  if ((vreg != 0xffffffff) && (insn_uses(insn,used_vregs), used_vregs[0] != -1)) {
    cVar7 = insn->class_code;
    bVar18 = false;
    if (cVar7 == '\0') {
      bVar18 = insn->insn_code == '(';
    }
    if (used_vregs[2] != vreg && (used_vregs[1] != vreg && used_vregs[0] != vreg)) {
      if (c->dill_debug != 0) {
        pvVar11 = (void *)(ulong)(uint)loc;
        printf("Try to replace %d ");
        virtual_print_insn(c,pvVar11,insn);
        putchar(10);
        cVar7 = insn->class_code;
      }
      bVar19 = false;
      if ((byte)(cVar7 - 5U) < 2) {
        bVar19 = (insn->insn_code & 0x10U) == 0;
      }
      uVar13 = (ulong)(loc + 1);
      pvVar12 = insns + uVar13;
      uVar16 = loc + 2;
      uVar14 = uVar13;
      for (iVar9 = 0; (pvVar12 = pvVar12 + 1, (long)uVar14 <= bb->end && (iVar9 == 0));
          iVar9 = iVar9 + (uint)(bVar15 & bVar19)) {
        pvVar10 = insns + uVar14;
        vreg_00 = insn_defines(pvVar10);
        iVar8 = insn_define_test(pvVar10,vreg);
        iVar9 = insn_define_test(pvVar10,used_vregs[0]);
        iVar9 = iVar9 + iVar8;
        if (used_vregs[1] != -1) {
          iVar8 = insn_define_test(pvVar10,used_vregs[1]);
          iVar9 = iVar9 + iVar8;
        }
        pvVar11 = (void *)(ulong)(uint)used_vregs[2];
        if (used_vregs[2] != -1) {
          iVar8 = insn_define_test(pvVar10,used_vregs[2]);
          iVar9 = iVar9 + iVar8;
        }
        if ((byte)(pvVar10->class_code - 5U) < 2) {
          bVar15 = (pvVar10->insn_code & 0x10U) >> 4;
        }
        else {
          bVar15 = 0;
        }
        if ((((bVar18) && (pvVar10->class_code == '\x06')) && ((pvVar10->opnds).a3.src1 == vreg)) &&
           ((pvVar10->opnds).bri.imm_a == (void *)0x0)) {
          bVar6 = true;
          if (c->p->vregs[(long)(int)vreg + -100].use_info.use_count == 1) {
            if (c->dill_debug != 0) {
              printf("load opt, changing  - ");
              virtual_print_insn(c,pvVar11,pvVar10);
              printf(" - to - ");
            }
            pvVar10->class_code = '\x05';
            (pvVar10->opnds).a3.src1 = used_vregs[0];
            (pvVar10->opnds).a3.src2 = used_vregs[1];
            if (c->dill_debug != 0) {
              virtual_print_insn(c,pvVar11,pvVar10);
              putchar(10);
            }
            pvVar5 = c->p->vregs;
            if (99 < (int)vreg) {
              pvVar5[(ulong)vreg - 100].use_info.use_count =
                   pvVar5[(ulong)vreg - 100].use_info.use_count + -1;
            }
            if (pvVar5[(long)(int)vreg + -100].use_info.use_count != 0) goto LAB_00111254;
            psVar1 = &pvVar5[(long)(int)vreg + -100].use_info.def_count;
            *psVar1 = *psVar1 + -1;
            if (c->dill_debug != 0) {
              printf("load opt eliminating  - ");
              virtual_print_insn(c,pvVar11,insn);
              putchar(10);
            }
            insn->class_code = '\x18';
            bVar6 = true;
          }
        }
        else {
LAB_00111254:
          bVar6 = bVar18;
          if (vreg_00 != ~DILL_NOP) {
            iVar8 = insn_use_test(pvVar10,vreg);
            if (iVar8 != 0) {
              bVar18 = false;
            }
            cVar7 = pvVar10->class_code;
            bVar6 = bVar18;
            if (cVar7 == insn->class_code) {
              cVar2 = pvVar10->insn_code;
              cVar3 = insn->insn_code;
              switch(cVar7) {
              case '\0':
              case '\x05':
switchD_001112a1_caseD_0:
                if ((cVar2 == cVar3) &&
                   (((pvVar10->opnds).a3.src1 == (insn->opnds).a3.src1 &&
                    ((pvVar10->opnds).a3.src2 == (insn->opnds).a3.src2)))) {
LAB_00111410:
                  iVar8 = live_at_end(bb,vreg_00);
                  if (iVar8 == 0) {
                    if (c->dill_debug != 0) {
                      pvVar11 = (void *)(uVar14 & 0xffffffff);
                      printf("eliminating  - - %d - ");
                      virtual_print_insn(c,pvVar11,pvVar10);
                      putchar(10);
                      cVar7 = pvVar10->class_code;
                    }
                    if ((((long)uVar13 < (long)uVar14 && cVar7 == '\x05') &&
                        (pvVar10[-1].class_code == '\x0e')) && (pvVar10[-1].opnds.a3.dest == 1)) {
                      pvVar10[-1].class_code = '\x18';
                    }
                    pvVar10->class_code = '\x18';
                    bVar18 = true;
                    pvVar10 = pvVar12;
                    uVar17 = uVar14;
                    local_94 = uVar16;
                    while (((long)uVar17 < bb->end && (bVar18))) {
                      iVar8 = insn_define_test(pvVar10,vreg_00);
                      bVar18 = iVar8 == 0;
                      iVar8 = insn_use_test(pvVar10,vreg_00);
                      if (iVar8 == 0) goto LAB_00111615;
                      if (c->dill_debug != 0) {
                        pvVar11 = (void *)(ulong)vreg;
                        printf("   Reg %d forward subst - Replacing %d ",pvVar11,(ulong)local_94);
                        virtual_print_insn(c,pvVar11,pvVar10);
                        printf(" with ");
                      }
                      switch(pvVar10->class_code) {
                      case '\0':
                      case '\x16':
                        if ((pvVar10->opnds).a3.src1 != vreg_00) {
                          if ((pvVar10->opnds).a3.src2 != vreg_00) goto switchD_0011156d_caseD_7;
                          goto LAB_001115ae;
                        }
                        goto LAB_00111579;
                      case '\x03':
                      case '\f':
                      case '\x0f':
                        goto switchD_0011156d_caseD_3;
                      case '\x05':
                        if ((pvVar10->opnds).a3.src1 == vreg_00) goto LAB_00111579;
                        if ((pvVar10->opnds).a3.src2 != vreg_00) goto LAB_001115ce;
LAB_001115ae:
                        (pvVar10->opnds).a3.src2 = vreg;
                        break;
                      case '\x06':
                        if ((pvVar10->opnds).a3.src1 == vreg_00) goto LAB_00111579;
LAB_001115ce:
                        if ((pvVar10->insn_code & 0x10U) == 0) goto switchD_0011156d_caseD_7;
switchD_0011156d_caseD_3:
                        if ((pvVar10->opnds).a3.dest != vreg_00) goto switchD_0011156d_caseD_7;
LAB_001115e2:
                        (pvVar10->opnds).a3.dest = vreg;
                        break;
                      default:
                        goto switchD_0011156d_caseD_7;
                      case '\v':
                        if ((pvVar10->opnds).a3.dest == vreg_00) goto LAB_001115e2;
                      case '\x01':
                      case '\x02':
                      case '\x04':
                      case '\t':
                      case '\x15':
                        if ((pvVar10->opnds).a3.src1 != vreg_00) {
switchD_0011156d_caseD_7:
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/dill/dill/virtual.c"
                                        ,0x3b7,"void replace_insn_src(virtual_insn *, int, int)");
                        }
LAB_00111579:
                        (pvVar10->opnds).a3.src1 = vreg;
                        break;
                      case '\x11':
                        sVar4 = (pvVar10->opnds).spec.type;
                        if ((sVar4 != vreg_00) || ((sVar4 & 0x8000) != DILL_NOP))
                        goto switchD_0011156d_caseD_7;
                        goto LAB_001115e2;
                      }
                      pvVar11 = (void *)(ulong)vreg;
                      set_used(c,vreg);
                      if (c->dill_debug != 0) {
                        virtual_print_insn(c,pvVar11,pvVar10);
                        putchar(10);
                      }
LAB_00111615:
                      pvVar10 = pvVar10 + 1;
                      local_94 = local_94 + 1;
                      uVar17 = uVar17 + 1;
                    }
                  }
                  goto LAB_00111430;
                }
                break;
              case '\x01':
              case '\x06':
                if (cVar2 == cVar3) {
LAB_001113f8:
                  if (((pvVar10->opnds).a3.src1 == (insn->opnds).a3.src1) &&
                     ((pvVar10->opnds).bri.imm_a == (insn->opnds).bri.imm_a)) goto LAB_00111410;
                }
                break;
              case '\x02':
              case '\x04':
              case '\t':
                if ((cVar2 == cVar3) && ((pvVar10->opnds).a3.src1 == (insn->opnds).a3.src1))
                goto LAB_00111410;
                break;
              case '\x03':
              case '\a':
              case '\b':
                break;
              default:
                if (cVar7 == '\x15') goto LAB_001113f8;
                if (cVar7 == '\x16') goto switchD_001112a1_caseD_0;
              }
            }
          }
        }
LAB_00111430:
        bVar18 = bVar6;
        uVar14 = uVar14 + 1;
        uVar16 = uVar16 + 1;
      }
      if (c->dill_debug != 0) {
        puts("stopped ");
        return;
      }
    }
  }
  return;
}

Assistant:

static void
do_com_sub_exp(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* root_insn = &((virtual_insn*)insns)[loc];
    int def_vreg = insn_defines(root_insn);
    int do_ldi0_optim = 0;
    int k;
    int stop = 0;
    int used_vregs[3];
    int root_is_load;
    if (def_vreg == -1)
        return;
    insn_uses(root_insn, &used_vregs[0]);
    if (used_vregs[0] == -1)
        return;
    if ((root_insn->class_code == iclass_arith3) &&
        (root_insn->insn_code == dill_jmp_addp))
        do_ldi0_optim = 1;

    if (def_vreg != -1) {
        if ((used_vregs[0] == def_vreg) || (used_vregs[1] == def_vreg) ||
            (used_vregs[2] == def_vreg))
            return;
    }

    /*
     * see if we can find an instruction just like (
     * except for dest) this ahead
     */
    if (c->dill_debug) {
        printf("Try to replace %d ", loc);
        virtual_print_insn(c, NULL, root_insn);
        printf("\n");
    }
    root_is_load = (((root_insn->class_code == iclass_loadstorei) ||
                     (root_insn->class_code == iclass_loadstore)) &&
                    (((root_insn->insn_code & 0x10) == 0x10) == 0));
    for (k = loc + 1; ((k <= bb->end) && (!stop)); k++) {
        virtual_insn* ip = &((virtual_insn*)insns)[k];
        int replace_vreg = insn_defines(ip);
        int l, stop2, insn_is_store;
        /* stop looking if old dest is wiped */
        if (insn_define_test(ip, def_vreg))
            stop++;
        /* stop looking if srcs become different */
        if (insn_define_test(ip, used_vregs[0]))
            stop++;
        if ((used_vregs[1] != -1) && insn_define_test(ip, used_vregs[1]))
            stop++;
        if ((used_vregs[2] != -1) && insn_define_test(ip, used_vregs[2]))
            stop++;
        /* stop looking if this is a load and we're about to pass a store */
        insn_is_store = (((ip->class_code == iclass_loadstorei) ||
                          (ip->class_code == iclass_loadstore)) &&
                         ((ip->insn_code & 0x10) == 0x10));
        if (root_is_load && insn_is_store)
            stop++;

        if (do_ldi0_optim && (ip->class_code == iclass_loadstorei) &&
            (ip->opnds.a3i.src == def_vreg) && (ip->opnds.a3i.u.imm == 0)) {
            int use_target = 1;
            /*
             * we've found a load immediate with an imm of 0 and with
             * a source that is the result of a prior add
             * combine them.
             */
            if (def_vreg == used_vregs[0])
                use_target++;
            if (def_vreg == used_vregs[1])
                use_target++;
            if ((use_target != 0) &&
                (c->p->vregs[def_vreg - 100].use_info.use_count !=
                 use_target)) {
                continue;
            }
            if (c->dill_debug) {
                printf("load opt, changing  - ");
                virtual_print_insn(c, NULL, ip);
                printf(" - to - ");
            }
            ip->class_code = iclass_loadstore;
            ip->opnds.a3.dest = ip->opnds.a3i.dest;
            ip->opnds.a3.src1 = used_vregs[0];
            ip->opnds.a3.src2 = used_vregs[1];
            if (c->dill_debug) {
                virtual_print_insn(c, NULL, ip);
                printf("\n");
            }
            if (def_vreg >= 100) {
                c->p->vregs[def_vreg - 100].use_info.use_count--;
            }
            if (c->p->vregs[def_vreg - 100].use_info.use_count ==
                (use_target - 1)) {
                c->p->vregs[def_vreg - 100].use_info.def_count--;
                if (c->dill_debug) {
                    printf("load opt eliminating  - ");
                    virtual_print_insn(c, NULL, root_insn);
                    printf("\n");
                }
                root_insn->class_code = iclass_nop;
                continue;
            }
        }

        if (replace_vreg == -1)
            continue;
        if (insn_use_test(ip, def_vreg))
            do_ldi0_optim = 0;

        /*
         * insn is the same except for dest, make it a noop
         * and fixup uses of replace_vreg going forward
         */
        if (!insn_same_except_dest(ip, root_insn))
            continue;
        if (live_at_end(bb, replace_vreg))
            continue;
        if (c->dill_debug) {
            printf("eliminating  - - %d - ", k);
            virtual_print_insn(c, NULL, ip);
            printf("\n");
        }

        if (ip->class_code == iclass_loadstore) {
            if (k > loc + 1) {
                virtual_insn* previous_ip = &((virtual_insn*)insns)[k - 1];
                if ((previous_ip->class_code == iclass_special) &&
                    (previous_ip->opnds.spec.type == DILL_SEGMENTED_FOLLOWS)) {
                    /*
                     * We're eliminating a loadstore and previous was a
                     * special SEGMENTED_FOLLOWS, kill the special too.
                     */
                    previous_ip->class_code = iclass_nop;
                }
            }
        }

        ip->class_code = iclass_nop;
        stop2 = 0;
        for (l = k + 1; ((l <= bb->end) && (!stop2)); l++) {
            virtual_insn* sub_ip = &((virtual_insn*)insns)[l];
            if (insn_define_test(sub_ip, replace_vreg)) {
                stop2++;
            }
            if (!insn_use_test(sub_ip, replace_vreg))
                continue;
            if (c->dill_debug) {
                printf("   Reg %d forward subst - Replacing %d ", def_vreg, l);
                virtual_print_insn(c, NULL, sub_ip);
                printf(" with ");
            }
            replace_insn_src(sub_ip, replace_vreg, def_vreg);
            set_used(c, def_vreg);
            if (c->dill_debug) {
                virtual_print_insn(c, NULL, sub_ip);
                printf("\n");
            }
        }
    }
    if (c->dill_debug) {
        printf("stopped \n");
    }
}